

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

t_operand __thiscall
xemmai::ast::t_try::f_emit(t_try *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  unsigned_long a_operand_00;
  t_targets *ptVar1;
  pointer puVar2;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> uVar3;
  t_variable *ptVar4;
  size_t a_stack;
  t_label *ptVar5;
  t_label *ptVar6;
  t_emit *ptVar7;
  t_label *ptVar8;
  t_label *ptVar9;
  size_t *psVar10;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_> *p;
  pointer puVar11;
  t_operand tVar12;
  t_label *local_d0;
  size_t stack;
  t_emit *local_a8;
  t_label *local_a0;
  anon_class_16_2_864c0342 operand;
  anon_class_16_2_864c0342 join;
  
  t_emit::f_join(a_emit,&this->v_junction_try);
  t_emit::f_merge(a_emit,&this->v_junction_try);
  a_operand_00 = a_emit->v_stack;
  stack = a_operand_00;
  ptVar5 = t_emit::f_label(a_emit);
  ptVar6 = t_emit::f_label(a_emit);
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__TRY);
  ptVar7 = t_emit::operator<<(ptVar7,a_operand_00);
  ptVar7 = t_emit::operator<<(ptVar7,ptVar5);
  t_emit::operator<<(ptVar7,ptVar6);
  ptVar1 = a_emit->v_targets;
  ptVar7 = (t_emit *)t_emit::f_label(a_emit);
  ptVar8 = t_emit::f_label(a_emit);
  ptVar9 = t_emit::f_label(a_emit);
  operand.a_emit = ptVar7;
  if (ptVar1->v_break == (t_label *)0x0) {
    operand.a_emit = (t_emit *)0x0;
  }
  operand.stack = (size_t *)&this->v_junction_finally;
  a_emit->v_targets = (t_targets *)&operand;
  local_a8 = ptVar7;
  local_a0 = ptVar8;
  anon_unknown_11::f_emit_block(a_emit,&this->v_block,false,a_clear,false);
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
  t_emit::operator<<(ptVar7,c_try__STEP);
  ptVar5->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  puVar2 = (this->v_catches).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar11 = (this->v_catches).
                 super__Vector_base<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar2; puVar11 = puVar11 + 1
      ) {
    if (!a_clear) {
      a_emit->v_stack = a_emit->v_stack - 1;
    }
    uVar3._M_t.super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
    ._M_t.super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
    super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
         (((puVar11->_M_t).
           super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
           ._M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
           .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl)->v_expression)
         ._M_t;
    (**(code **)(*(long *)uVar3._M_t.
                          super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                          .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl + 0x18))
              (uVar3._M_t.
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl,a_emit,0,0);
    ptVar5 = t_emit::f_label(a_emit);
    a_emit->v_stack = a_emit->v_stack - 1;
    ptVar7 = t_emit::operator<<(a_emit,c_instruction__CATCH);
    ptVar7 = t_emit::operator<<(ptVar7,ptVar5);
    ptVar4 = ((puVar11->_M_t).
              super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
              ._M_t.
              super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
              .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl)->v_variable
    ;
    t_emit::operator<<(ptVar7,-(ulong)ptVar4->v_shared ^ ptVar4->v_index);
    anon_unknown_11::f_emit_block
              (a_emit,&((puVar11->_M_t).
                        super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
                        .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl)->
                       v_block,false,a_clear,false);
    ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
    t_emit::operator<<(ptVar7,c_try__STEP);
    ptVar5->v_target =
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
  t_emit::operator<<(ptVar7,c_try__THROW);
  local_a8->v_code =
       (t_code *)
       ((long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3);
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
  t_emit::operator<<(ptVar7,c_try__BREAK);
  local_a0->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
  t_emit::operator<<(ptVar7,c_try__CONTINUE);
  ptVar9->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  ptVar7 = t_emit::operator<<(a_emit,c_instruction__FINALLY);
  t_emit::operator<<(ptVar7,c_try__RETURN);
  ptVar6->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  operand.a_emit = (t_emit *)0x0;
  operand.stack = (size_t *)0x0;
  a_emit->v_targets = (t_targets *)&operand;
  if (a_clear) {
    t_emit::f_push(a_emit);
    anon_unknown_11::f_emit_block_without_value(a_emit,&this->v_finally);
    a_emit->v_stack = a_emit->v_stack - 1;
  }
  else {
    anon_unknown_11::f_emit_block_without_value(a_emit,&this->v_finally);
  }
  t_emit::operator<<(a_emit,c_instruction__YRT);
  operand.a_emit = a_emit;
  operand.stack = &stack;
  psVar10 = &ptVar1->v_break_stack;
  if (ptVar1->v_break_must_clear != false) {
    psVar10 = &stack;
  }
  a_stack = *psVar10;
  ptVar5 = f_emit::anon_class_16_2_864c0342::operator()
                     (&operand,ptVar1->v_break,ptVar1->v_break_junction,a_stack);
  ptVar6 = f_emit::anon_class_16_2_864c0342::operator()
                     (&operand,ptVar1->v_continue,ptVar1->v_continue_junction,stack);
  ptVar8 = f_emit::anon_class_16_2_864c0342::operator()
                     (&operand,ptVar1->v_return,ptVar1->v_return_junction,ptVar1->v_return_stack);
  if ((ptVar5 != (t_label *)0x0 || ptVar6 != (t_label *)0x0) || ptVar8 != (t_label *)0x0) {
    local_d0 = t_emit::f_label(a_emit);
    ptVar7 = t_emit::operator<<(a_emit,c_instruction__JUMP);
    t_emit::operator<<(ptVar7,local_d0);
  }
  else {
    local_d0 = (t_label *)0x0;
  }
  join.a_emit = a_emit;
  join.stack = &stack;
  f_emit::anon_class_16_2_864c0342::operator()
            (&join,ptVar5,ptVar1->v_break,ptVar1->v_break_junction,a_stack);
  f_emit::anon_class_16_2_864c0342::operator()
            (&join,ptVar6,ptVar1->v_continue,ptVar1->v_continue_junction,stack);
  f_emit::anon_class_16_2_864c0342::operator()
            (&join,ptVar8,ptVar1->v_return,ptVar1->v_return_junction,ptVar1->v_return_stack);
  if ((ptVar5 != (t_label *)0x0 || ptVar6 != (t_label *)0x0) || ptVar8 != (t_label *)0x0) {
    local_d0->v_target =
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  a_emit->v_targets = ptVar1;
  tVar12.field_1.v_integer = extraout_RDX.v_integer;
  tVar12._0_8_ = 4;
  return tVar12;
}

Assistant:

t_operand t_try::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	a_emit.f_join(v_junction_try);
	a_emit.f_merge(v_junction_try);
	auto stack = a_emit.v_stack;
	auto& catch0 = a_emit.f_label();
	auto& finally0 = a_emit.f_label();
	a_emit << c_instruction__TRY << stack << catch0 << finally0;
	auto targets0 = a_emit.v_targets;
	{
		auto& break0 = a_emit.f_label();
		auto& continue0 = a_emit.f_label();
		auto& return0 = a_emit.f_label();
		t_emit::t_targets targets1{targets0->v_break ? &break0 : nullptr, &v_junction_finally, stack, false, targets0->v_break_must_clear, targets0->v_continue ? &continue0 : nullptr, &v_junction_finally, targets0->v_return ? &return0 : nullptr, &v_junction_finally, stack, false};
		a_emit.v_targets = &targets1;
		f_emit_block(a_emit, v_block, false, a_clear);
		a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
		a_emit.f_target(catch0);
		for (auto& p : v_catches) {
			if (!a_clear) a_emit.f_pop();
			p->v_expression->f_emit(a_emit, false, false);
			auto& label0 = a_emit.f_label();
			a_emit.f_pop() << c_instruction__CATCH << label0 << (p->v_variable.v_shared ? ~p->v_variable.v_index : p->v_variable.v_index);
			f_emit_block(a_emit, p->v_block, false, a_clear);
			a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
			a_emit.f_target(label0);
		}
		a_emit << c_instruction__FINALLY << t_code::c_try__THROW;
		a_emit.f_target(break0);
		a_emit << c_instruction__FINALLY << t_code::c_try__BREAK;
		a_emit.f_target(continue0);
		a_emit << c_instruction__FINALLY << t_code::c_try__CONTINUE;
		a_emit.f_target(return0);
		a_emit << c_instruction__FINALLY << t_code::c_try__RETURN;
	}
	a_emit.f_target(finally0);
	{
		t_emit::t_targets targets2{nullptr, nullptr, 0, false, false, nullptr, nullptr, nullptr, nullptr, 0, false};
		a_emit.v_targets = &targets2;
		if (a_clear) a_emit.f_push();
		f_emit_block_without_value(a_emit, v_finally);
		if (a_clear) a_emit.f_pop();
	}
	a_emit << c_instruction__YRT;
	auto operand = [&](t_emit::t_label* a_label, t_block* a_junction, size_t a_stack) -> t_emit::t_label*
	{
		if (!a_label) {
			a_emit << size_t(0);
			return nullptr;
		}
		auto jump = [&]
		{
			auto label = &a_emit.f_label();
			a_emit << *label;
			return label;
		};
		if (stack > a_stack) return jump();
		for (size_t i = 0; i < a_junction->v_privates.size(); ++i) {
			if ((*a_emit.v_privates)[i]) continue;
			auto& x = a_junction->v_privates[i];
			if (x.v_use && x.v_in) return jump();
		}
		a_emit << *a_label;
		return nullptr;
	};
	auto break_stack = targets0->v_break_must_clear ? stack : targets0->v_break_stack;
	auto break0 = operand(targets0->v_break, targets0->v_break_junction, break_stack);
	auto continue0 = operand(targets0->v_continue, targets0->v_continue_junction, stack);
	auto return0 = operand(targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	auto step = break0 || continue0 || return0 ? &a_emit.f_label() : nullptr;
	if (step) a_emit << c_instruction__JUMP << *step;
	auto join = [&](t_emit::t_label* a_label0, t_emit::t_label* a_label1, t_block* a_junction, size_t a_stack)
	{
		if (!a_label0) return;
		a_emit.f_target(*a_label0);
		if (stack > a_stack) a_emit << c_instruction__STACK_GET << a_stack << stack;
		a_emit.f_join(*a_junction);
		a_emit << c_instruction__JUMP << *a_label1;
	};
	join(break0, targets0->v_break, targets0->v_break_junction, break_stack);
	join(continue0, targets0->v_continue, targets0->v_continue_junction, stack);
	join(return0, targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	if (step) a_emit.f_target(*step);
	a_emit.v_targets = targets0;
	return {};
}